

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iomapper.cpp
# Opt level: O2

int __thiscall
glslang::TDefaultIoResolver::resolveBinding
          (TDefaultIoResolver *this,EShLanguage stage,TVarEntryInfo *ent)

{
  int iVar1;
  uint set;
  int iVar2;
  TResourceType res;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  TType *type;
  
  iVar1 = (*(ent->symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])();
  type = (TType *)CONCAT44(extraout_var,iVar1);
  set = TDefaultIoResolverBase::getLayoutSet(type);
  iVar1 = 1;
  if ((((this->super_TDefaultIoResolverBase).referenceIntermediate)->spvVersion).openGl != 0) {
    iVar2 = (*type->_vptr_TType[0x1e])(type);
    if ((char)iVar2 != '\0') {
      iVar1 = (*type->_vptr_TType[0x11])(type);
    }
  }
  res = (*(this->super_TDefaultIoResolverBase).super_TIoMapResolver._vptr_TIoMapResolver[0x15])
                  (this,type);
  iVar2 = -1;
  if ((int)res < 6) {
    iVar3 = (*type->_vptr_TType[0xb])(type);
    if ((short)((ulong)*(undefined8 *)(CONCAT44(extraout_var_00,iVar3) + 0x1c) >> 0x20) == -1) {
      if ((ent->live == true) &&
         (((this->super_TDefaultIoResolverBase).referenceIntermediate)->autoMapBindings == true)) {
        iVar2 = TDefaultIoResolverBase::getBaseBinding
                          (&this->super_TDefaultIoResolverBase,stage,res,set);
        iVar2 = TDefaultIoResolverBase::getFreeSlot
                          (&this->super_TDefaultIoResolverBase,set,iVar2,iVar1);
      }
    }
    else {
      iVar2 = TDefaultIoResolverBase::getBaseBinding
                        (&this->super_TDefaultIoResolverBase,stage,res,set);
      iVar3 = (*type->_vptr_TType[0xb])(type);
      iVar2 = (uint)*(ushort *)(CONCAT44(extraout_var_01,iVar3) + 0x20) + iVar2;
      TDefaultIoResolverBase::reserveSlot(&this->super_TDefaultIoResolverBase,set,iVar2,iVar1);
    }
  }
  ent->newBinding = iVar2;
  return iVar2;
}

Assistant:

int resolveBinding(EShLanguage stage, TVarEntryInfo& ent) override {
        const TType& type = ent.symbol->getType();
        const int set = getLayoutSet(type);
        // On OpenGL arrays of opaque types take a seperate binding for each element
        int numBindings = referenceIntermediate.getSpv().openGl != 0 && type.isSizedArray() ? type.getCumulativeArraySize() : 1;
        TResourceType resource = getResourceType(type);
        if (resource < EResCount) {
            if (type.getQualifier().hasBinding()) {
                return ent.newBinding = reserveSlot(
                           set, getBaseBinding(stage, resource, set) + type.getQualifier().layoutBinding, numBindings);
            } else if (ent.live && doAutoBindingMapping()) {
                // find free slot, the caller did make sure it passes all vars with binding
                // first and now all are passed that do not have a binding and needs one
                return ent.newBinding = getFreeSlot(set, getBaseBinding(stage, resource, set), numBindings);
            }
        }
        return ent.newBinding = -1;
    }